

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

lu_mem traversestack(global_State *g,lua_State *th)

{
  int iVar1;
  StkId pTVar2;
  CallInfo *local_40;
  CallInfo *ci;
  StkId lim;
  StkId o;
  int n;
  lua_State *th_local;
  global_State *g_local;
  
  o._4_4_ = 0;
  lim = th->stack;
  if (lim == (StkId)0x0) {
    g_local = (global_State *)0x1;
  }
  else {
    for (; lim < th->top; lim = lim + 1) {
      if (((lim->tt_ & 0x40U) != 0) && (((byte)(lim->value_).f[9] & 3) != 0)) {
        reallymarkobject(g,(lim->value_).gc);
      }
    }
    if (g->gcstate == '\x01') {
      pTVar2 = th->stack;
      iVar1 = th->stacksize;
      for (; lim < pTVar2 + iVar1; lim = lim + 1) {
        lim->tt_ = 0;
      }
    }
    else {
      for (local_40 = &th->base_ci; local_40 != th->ci; local_40 = local_40->next) {
        o._4_4_ = o._4_4_ + 1;
      }
    }
    g_local = (global_State *)((long)th->stacksize * 0x10 + 0xd0 + (long)o._4_4_ * 0x50);
  }
  return (lu_mem)g_local;
}

Assistant:

static lu_mem traversestack (global_State *g, lua_State *th) {
  int n = 0;
  StkId o = th->stack;
  if (o == NULL)
    return 1;  /* stack not completely built yet */
  for (; o < th->top; o++)  /* mark live elements in the stack */
    markvalue(g, o);
  if (g->gcstate == GCSatomic) {  /* final traversal? */
    StkId lim = th->stack + th->stacksize;  /* real end of stack */
    for (; o < lim; o++)  /* clear not-marked stack slice */
      setnilvalue(o);
  }
  else {  /* count call infos to compute size */
    CallInfo *ci;
    for (ci = &th->base_ci; ci != th->ci; ci = ci->next)
      n++;
  }
  return sizeof(lua_State) + sizeof(TValue) * th->stacksize +
         sizeof(CallInfo) * n;
}